

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_struct_value(mg_session *session,mg_value *value)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  char *fmt;
  
  sVar2 = session->in_cursor;
  if (session->in_end < sVar2 + 2) {
    fmt = "unexpected end of message";
  }
  else {
    if ((session->in_buffer[sVar2] & 0xf0U) == 0xb0) {
      bVar1 = session->in_buffer[sVar2 + 1];
      if (bVar1 < 100) {
        switch(bVar1) {
        case 0x44:
          value->type = MG_VALUE_TYPE_DATE;
          iVar3 = mg_session_read_date(session,&(value->field_1).date_v);
          return iVar3;
        case 0x45:
          value->type = MG_VALUE_TYPE_DURATION;
          iVar3 = mg_session_read_duration(session,&(value->field_1).duration_v);
          return iVar3;
        case 0x46:
          value->type = MG_VALUE_TYPE_DATE_TIME;
          iVar3 = mg_session_read_date_time(session,&(value->field_1).date_time_v);
          return iVar3;
        case 0x4e:
          value->type = MG_VALUE_TYPE_NODE;
          iVar3 = mg_session_read_node(session,&(value->field_1).node_v);
          return iVar3;
        case 0x50:
          value->type = MG_VALUE_TYPE_PATH;
          iVar3 = mg_session_read_path(session,&(value->field_1).path_v);
          return iVar3;
        case 0x52:
          value->type = MG_VALUE_TYPE_RELATIONSHIP;
          iVar3 = mg_session_read_relationship(session,&(value->field_1).relationship_v);
          return iVar3;
        case 0x54:
          value->type = MG_VALUE_TYPE_TIME;
          iVar3 = mg_session_read_time(session,&(value->field_1).time_v);
          return iVar3;
        case 0x58:
          value->type = MG_VALUE_TYPE_POINT_2D;
          iVar3 = mg_session_read_point_2d(session,&(value->field_1).point_2d_v);
          return iVar3;
        case 0x59:
          value->type = MG_VALUE_TYPE_POINT_3D;
          iVar3 = mg_session_read_point_3d(session,&(value->field_1).point_3d_v);
          return iVar3;
        }
      }
      else if (bVar1 < 0x72) {
        if (bVar1 == 100) {
          value->type = MG_VALUE_TYPE_LOCAL_DATE_TIME;
          iVar3 = mg_session_read_local_date_time(session,&(value->field_1).local_date_time_v);
          return iVar3;
        }
        if (bVar1 == 0x66) {
          value->type = MG_VALUE_TYPE_DATE_TIME_ZONE_ID;
          iVar3 = mg_session_read_date_time_zone_id(session,&(value->field_1).date_time_zone_id_v);
          return iVar3;
        }
      }
      else {
        if (bVar1 == 0x72) {
          value->type = MG_VALUE_TYPE_UNBOUND_RELATIONSHIP;
          iVar3 = mg_session_read_unbound_relationship
                            (session,&(value->field_1).unbound_relationship_v);
          return iVar3;
        }
        if (bVar1 == 0x74) {
          value->type = MG_VALUE_TYPE_LOCAL_TIME;
          iVar3 = mg_session_read_local_time(session,&(value->field_1).local_time_v);
          return iVar3;
        }
      }
    }
    fmt = "unsupported value";
  }
  mg_session_set_error(session,fmt);
  return -6;
}

Assistant:

int mg_session_read_struct_value(mg_session *session, mg_value *value) {
  if (session->in_cursor + 2 > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }
  uint8_t *header = (uint8_t *)(session->in_buffer + session->in_cursor);
  uint8_t marker = (uint8_t)header[0];
  uint8_t signature = (uint8_t)header[1];

  if ((marker & 0xF0) != MG_MARKER_TINY_STRUCT) {
    mg_session_set_error(session, "unsupported value");
    return MG_ERROR_DECODING_FAILED;
  }

  switch (signature) {
    case MG_SIGNATURE_NODE:
      value->type = MG_VALUE_TYPE_NODE;
      return mg_session_read_node(session, &value->node_v);
    case MG_SIGNATURE_RELATIONSHIP:
      value->type = MG_VALUE_TYPE_RELATIONSHIP;
      return mg_session_read_relationship(session, &value->relationship_v);
    case MG_SIGNATURE_UNBOUND_RELATIONSHIP:
      value->type = MG_VALUE_TYPE_UNBOUND_RELATIONSHIP;
      return mg_session_read_unbound_relationship(
          session, &value->unbound_relationship_v);
    case MG_SIGNATURE_PATH:
      value->type = MG_VALUE_TYPE_PATH;
      return mg_session_read_path(session, &value->path_v);
    case MG_SIGNATURE_DATE:
      value->type = MG_VALUE_TYPE_DATE;
      return mg_session_read_date(session, &value->date_v);
    case MG_SIGNATURE_TIME:
      value->type = MG_VALUE_TYPE_TIME;
      return mg_session_read_time(session, &value->time_v);
    case MG_SIGNATURE_LOCAL_TIME:
      value->type = MG_VALUE_TYPE_LOCAL_TIME;
      return mg_session_read_local_time(session, &value->local_time_v);
    case MG_SIGNATURE_DATE_TIME:
      value->type = MG_VALUE_TYPE_DATE_TIME;
      return mg_session_read_date_time(session, &value->date_time_v);
    case MG_SIGNATURE_DATE_TIME_ZONE_ID:
      value->type = MG_VALUE_TYPE_DATE_TIME_ZONE_ID;
      return mg_session_read_date_time_zone_id(session,
                                               &value->date_time_zone_id_v);
    case MG_SIGNATURE_LOCAL_DATE_TIME:
      value->type = MG_VALUE_TYPE_LOCAL_DATE_TIME;
      return mg_session_read_local_date_time(session,
                                             &value->local_date_time_v);
    case MG_SIGNATURE_DURATION:
      value->type = MG_VALUE_TYPE_DURATION;
      return mg_session_read_duration(session, &value->duration_v);
    case MG_SIGNATURE_POINT_2D:
      value->type = MG_VALUE_TYPE_POINT_2D;
      return mg_session_read_point_2d(session, &value->point_2d_v);
    case MG_SIGNATURE_POINT_3D:
      value->type = MG_VALUE_TYPE_POINT_3D;
      return mg_session_read_point_3d(session, &value->point_3d_v);
  }

  mg_session_set_error(session, "unsupported value");
  return MG_ERROR_DECODING_FAILED;
}